

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  bVar1 = test_conv_2d_dw(3,1,1,0,1,false);
  bVar2 = test_conv_2d_dw(3,1,1,0,1,true);
  bVar3 = test_conv_2d_dw(0x2a,3,2,1,1,false);
  bVar4 = test_conv_2d_dw(0x2a,3,2,1,1,true);
  bVar5 = test_conv_2d_dw(8,5,1,2,2,false);
  bVar6 = test_conv_2d_dw(8,5,1,2,2,true);
  return (int)((!bVar6 || !bVar5) || ((!bVar4 || !bVar3) || (!bVar2 || !bVar1)));
}

Assistant:

int main(int argc, char ** argv) {
    bool passed = true;
    passed = test_conv_2d_dw(3, 1, 1, 0, 1, false) && passed;
    passed = test_conv_2d_dw(3, 1, 1, 0, 1, true) && passed;
    passed = test_conv_2d_dw(42, 3, 2, 1, 1, false) && passed;
    passed = test_conv_2d_dw(42, 3, 2, 1, 1, true) && passed;
    passed = test_conv_2d_dw(8, 5, 1, 2, 2, false) && passed;
    passed = test_conv_2d_dw(8, 5, 1, 2, 2, true) && passed;
    return passed ? 0 : 1;
}